

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O2

char * u_rtrim(char *s)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = strlen(s);
  pcVar2 = s + sVar1;
  while (((s < pcVar2 && ((ulong)(byte)pcVar2[-1] < 0x21)) &&
         ((0x100002600U >> ((ulong)(byte)pcVar2[-1] & 0x3f) & 1) != 0))) {
    pcVar2 = pcVar2 + -1;
    *pcVar2 = '\0';
  }
  return pcVar2;
}

Assistant:

U_CAPI char * U_EXPORT2
u_rtrim(char *s) {
    char *end=uprv_strchr(s, 0);
    while(s<end && U_IS_INV_WHITESPACE(*(end-1))) {
        *--end = 0;
    }
    return end;
}